

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher>::
streamReconstructedExpression
          (MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher> *this,ostream *os)

{
  undefined8 uVar1;
  __type _Var2;
  ostream *poVar3;
  char **e;
  string local_58;
  undefined1 local_38 [8];
  string matcherAsString;
  ostream *os_local;
  MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher> *this_local;
  
  matcherAsString.field_2._8_8_ = os;
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            ((string *)local_38,(MatcherUntypedBase *)&this->m_matcher);
  uVar1 = matcherAsString.field_2._8_8_;
  Detail::stringify<char_const*>(&local_58,(Detail *)this->m_arg,e);
  poVar3 = std::operator<<((ostream *)uVar1,(string *)&local_58);
  std::operator<<(poVar3,' ');
  std::__cxx11::string::~string((string *)&local_58);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)Detail::unprintableString_abi_cxx11_);
  if (_Var2) {
    Catch::operator<<((ostream *)matcherAsString.field_2._8_8_,&this->m_matcherString);
  }
  else {
    std::operator<<((ostream *)matcherAsString.field_2._8_8_,(string *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }